

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml.c
# Opt level: O2

void libxml_xmlErrorFuncHandler(void *ctx,char *msg,...)

{
  char in_AL;
  int iVar1;
  PyObject *op;
  PyObject *pPVar2;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  undefined1 local_4a8 [16];
  undefined8 local_498;
  undefined8 local_490;
  undefined8 local_488;
  undefined8 local_480;
  undefined8 local_478;
  undefined8 local_468;
  undefined8 local_458;
  undefined8 local_448;
  undefined8 local_438;
  undefined8 local_428;
  undefined8 local_418;
  undefined8 local_408;
  char str [1000];
  
  ap[0].reg_save_area = local_4a8;
  if (in_AL != '\0') {
    local_478 = in_XMM0_Qa;
    local_468 = in_XMM1_Qa;
    local_458 = in_XMM2_Qa;
    local_448 = in_XMM3_Qa;
    local_438 = in_XMM4_Qa;
    local_428 = in_XMM5_Qa;
    local_418 = in_XMM6_Qa;
    local_408 = in_XMM7_Qa;
  }
  ap[0].gp_offset = 0x10;
  ap[0].fp_offset = 0x30;
  ap[0].overflow_arg_area = &stack0x00000008;
  local_498 = in_RDX;
  local_490 = in_RCX;
  local_488 = in_R8;
  local_480 = in_R9;
  if (libxml_xmlPythonErrorFuncHandler == (PyObject *)0x0) {
    vfprintf(_stderr,msg,ap);
  }
  else {
    iVar1 = vsnprintf(str,999,msg,ap);
    if (0x3e5 < iVar1) {
      str[999] = '\0';
    }
    op = (PyObject *)PyTuple_New(2);
    PyTuple_SetItem(op,0,libxml_xmlPythonErrorFuncCtxt);
    if (libxml_xmlPythonErrorFuncCtxt != (PyObject *)0x0) {
      libxml_xmlPythonErrorFuncCtxt->ob_refcnt = libxml_xmlPythonErrorFuncCtxt->ob_refcnt + 1;
    }
    pPVar2 = libxml_charPtrConstWrap(str);
    PyTuple_SetItem(op,1,pPVar2);
    pPVar2 = (PyObject *)PyEval_CallObjectWithKeywords(libxml_xmlPythonErrorFuncHandler,op,0);
    _Py_XDECREF(op);
    _Py_XDECREF(pPVar2);
  }
  return;
}

Assistant:

static void
libxml_xmlErrorFuncHandler(ATTRIBUTE_UNUSED void *ctx, const char *msg,
                           ...)
{
    va_list ap;
    PyObject *list;
    PyObject *message;
    PyObject *result;
    char str[1000];

#ifdef DEBUG_ERROR
    printf("libxml_xmlErrorFuncHandler(%p, %s, ...) called\n", ctx, msg);
#endif


    if (libxml_xmlPythonErrorFuncHandler == NULL) {
        va_start(ap, msg);
        vfprintf(stderr, msg, ap);
        va_end(ap);
    } else {
        va_start(ap, msg);
        if (vsnprintf(str, 999, msg, ap) >= 998)
	    str[999] = 0;
        va_end(ap);

        list = PyTuple_New(2);
        PyTuple_SetItem(list, 0, libxml_xmlPythonErrorFuncCtxt);
        Py_XINCREF(libxml_xmlPythonErrorFuncCtxt);
        message = libxml_charPtrConstWrap(str);
        PyTuple_SetItem(list, 1, message);
        result = PyEval_CallObject(libxml_xmlPythonErrorFuncHandler, list);
        Py_XDECREF(list);
        Py_XDECREF(result);
    }
}